

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::GenerateImportPropertyCode
          (cmExportFileGenerator *this,ostream *os,string *config,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  pointer pcVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  string targetName;
  string local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  pcVar1 = (this->Namespace)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->Namespace)._M_string_length);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_70,target);
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Import target \"",0x11);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" for configuration \"",0x15);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(config->_M_dataplus)._M_p,config->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"set_property(TARGET ",0x14);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," APPEND PROPERTY IMPORTED_CONFIGURATIONS ",0x29);
  if (config->_M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"NOCONFIG",8);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_70,config);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_70._M_dataplus._M_p,local_70._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"set_target_properties(",0x16);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," PROPERTIES\n",0xc);
  p_Var3 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      cmExportFileGeneratorEscape(&local_70,(string *)(p_Var3 + 2));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"  )\n",4);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportPropertyCode(
  std::ostream& os, const std::string& config, cmGeneratorTarget const* target,
  ImportPropertyMap const& properties)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;

  targetName += target->GetExportName();

  // Set the import properties.
  os << "# Import target \"" << targetName << "\" for configuration \""
     << config << "\"\n";
  os << "set_property(TARGET " << targetName
     << " APPEND PROPERTY IMPORTED_CONFIGURATIONS ";
  if (!config.empty()) {
    os << cmSystemTools::UpperCase(config);
  } else {
    os << "NOCONFIG";
  }
  os << ")\n";
  os << "set_target_properties(" << targetName << " PROPERTIES\n";
  for (ImportPropertyMap::const_iterator pi = properties.begin();
       pi != properties.end(); ++pi) {
    os << "  " << pi->first << " " << cmExportFileGeneratorEscape(pi->second)
       << "\n";
  }
  os << "  )\n"
     << "\n";
}